

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v8::detail::vformat_to<char32_t>
               (buffer<char32_t> *buf,basic_string_view<char32_t> fmt,
               basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>
               args,locale_ref loc)

{
  char32_t *pend;
  size_t sVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out_00;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out_01;
  type tVar2;
  char32_t *pcVar3;
  char32_t *pbegin;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> it;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out_02;
  char32_t *pcVar4;
  bool bVar5;
  writer write;
  unkbyte10 in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff42;
  float local_b8;
  undefined4 uStack_b4;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  default_arg_formatter<char32_t> local_a8;
  buffer<char32_t> *local_88;
  char32_t *local_80;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>_2
  local_78;
  void *local_70;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> local_68;
  char32_t *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>_2
  local_58;
  locale_ref local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_a8.args.field_1 = args.field_1;
  local_a8.args.desc_ = args.desc_;
  local_78 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>_2
              )fmt.size_;
  pbegin = fmt.data_;
  if (((local_78.values_ ==
        (value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>
         *)0x2) && (*pbegin == L'{')) && (pbegin[1] == L'}')) {
    if ((long)local_a8.args.desc_ < 0) {
      if ((int)(type)args.desc_ < 1) {
        tVar2 = none_type;
      }
      else {
        sVar1 = ((local_a8.args.field_1.values_)->field_0).string.size;
        local_b8 = (float)((local_a8.args.field_1.values_)->field_0).ulong_long_value;
        uStack_b4 = (undefined4)
                    (((local_a8.args.field_1.values_)->field_0).ulong_long_value >> 0x20);
        uStack_b0 = (undefined2)sVar1;
        uStack_ae = (undefined6)(sVar1 >> 0x10);
        tVar2 = (local_a8.args.field_1.args_)->type_;
      }
    }
    else {
      tVar2 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
        sVar1 = ((local_a8.args.field_1.values_)->field_0).string.size;
        local_b8 = (float)((local_a8.args.field_1.values_)->field_0).ulong_long_value;
        uStack_b4 = (undefined4)
                    (((local_a8.args.field_1.values_)->field_0).ulong_long_value >> 0x20);
        uStack_b0 = (undefined2)sVar1;
        uStack_ae = (undefined6)(sVar1 >> 0x10);
      }
    }
    if (tVar2 == none_type) {
      ::fmt::v8::detail::throw_format_error("argument not found");
    }
    local_a8.out.container = buf;
    local_a8.loc.locale_ = loc.locale_;
    switch(tVar2) {
    case int_type:
      out_02.container._4_4_ = 0;
      out_02.container._0_4_ = local_b8;
      write<char32_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_int,_0>
                ((detail *)buf,out_02,0x197228);
      break;
    case uint_type:
      write<char32_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_unsigned_int,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)buf,(uint)local_b8);
      break;
    case long_long_type:
      out_00.container._4_4_ = uStack_b4;
      out_00.container._0_4_ = local_b8;
      write<char32_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_long_long,_0>
                ((detail *)buf,out_00,0x197228);
      break;
    case ulong_long_type:
      write<char32_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_unsigned_long_long,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)buf,
                 CONCAT44(uStack_b4,local_b8));
      break;
    case int128_type:
      out.container._4_4_ = uStack_b4;
      out.container._0_4_ = local_b8;
      value._10_6_ = in_stack_ffffffffffffff42;
      value._0_10_ = in_stack_ffffffffffffff38;
      write<char32_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,___int128,_0>
                ((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      out_01.container._4_4_ = uStack_b4;
      out_01.container._0_4_ = local_b8;
      value_00._10_6_ = in_stack_ffffffffffffff42;
      value_00._0_10_ = in_stack_ffffffffffffff38;
      write<char32_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_unsigned___int128,_0>
                ((detail *)buf,out_01,(unsigned___int128)value_00);
      break;
    case bool_type:
      default_arg_formatter<char32_t>::operator()(&local_a8,(bool)(local_b8._0_1_ & 1));
      break;
    case char_type:
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = (char32_t)local_b8;
      break;
    case float_type:
      write<char32_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_float,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)buf,local_b8);
      break;
    case double_type:
      write<char32_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_double,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)buf,
                 (double)CONCAT44(uStack_b4,local_b8));
      break;
    case last_numeric_type:
      default_arg_formatter<char32_t>::operator()
                (&local_a8,(longdouble)CONCAT28(uStack_b0,CONCAT44(uStack_b4,local_b8)));
      break;
    case cstring_type:
      write<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)buf,
                 (char32_t *)CONCAT44(uStack_b4,local_b8));
      break;
    case string_type:
      copy_str_noinline<char32_t,char32_t_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                ((char32_t *)CONCAT44(uStack_b4,local_b8),
                 (char32_t *)CONCAT44(uStack_b4,local_b8) + CONCAT62(uStack_ae,uStack_b0),
                 (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)buf);
      break;
    case pointer_type:
      default_arg_formatter<char32_t>::operator()(&local_a8,(void *)CONCAT44(uStack_b4,local_b8));
      break;
    case custom_type:
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_88 = buf;
      local_80 = (char32_t *)local_a8.args.desc_;
      local_78 = local_a8.args.field_1;
      local_70 = loc.locale_;
      (*(code *)CONCAT62(uStack_ae,uStack_b0))(CONCAT44(uStack_b4,local_b8));
      break;
    default:
      ::fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
                 ,0x820,"");
    }
  }
  else {
    local_70 = (void *)((ulong)local_70 & 0xffffffff00000000);
    pend = pbegin + (long)local_78;
    local_80 = pbegin;
    local_68.container = buf;
    local_60 = (char32_t *)local_a8.args.desc_;
    local_58 = local_a8.args.field_1;
    local_50.locale_ = loc.locale_;
    if ((long)local_78.values_ < 0x20) {
      if (local_78.values_ !=
          (value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>
           *)0x0) {
        pcVar4 = pbegin;
        do {
          pcVar3 = pcVar4 + 1;
          if (*pcVar4 == L'}') {
            if ((pcVar3 == pend) || (*pcVar3 != L'}')) {
              ::fmt::v8::detail::throw_format_error("unmatched \'}\' in format string");
            }
            vformat_to<char32_t>::format_handler::on_text((format_handler *)&local_88,pbegin,pcVar3)
            ;
            pcVar3 = pcVar4 + 2;
            pbegin = pcVar3;
          }
          else if (*pcVar4 == L'{') {
            vformat_to<char32_t>::format_handler::on_text((format_handler *)&local_88,pbegin,pcVar4)
            ;
            pcVar3 = parse_replacement_field<char32_t,fmt::v8::detail::vformat_to<char32_t>(fmt::v8::detail::buffer<char32_t>&,fmt::v8::basic_string_view<char32_t>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char32_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char32_t>::type>>>::type,fmt::v8::type_identity<char32_t>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                               (pcVar4,pend,(format_handler *)&local_88);
            pbegin = pcVar3;
          }
          pcVar4 = pcVar3;
        } while (pcVar3 != pend);
      }
      vformat_to<char32_t>::format_handler::on_text((format_handler *)&local_88,pbegin,pend);
    }
    else {
      local_a8.out.container = (buffer<char32_t> *)&local_88;
      do {
        if (pbegin == pend) {
          return;
        }
        pcVar4 = pbegin;
        if (*pbegin == L'{') {
LAB_00169b3b:
          parse_format_string<false,_char32_t,_format_handler>::writer::operator()
                    ((writer *)&local_a8,pbegin,pcVar4);
          pbegin = parse_replacement_field<char32_t,fmt::v8::detail::vformat_to<char32_t>(fmt::v8::detail::buffer<char32_t>&,fmt::v8::basic_string_view<char32_t>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char32_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char32_t>::type>>>::type,fmt::v8::type_identity<char32_t>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                             (pcVar4,pend,(format_handler *)&local_88);
          bVar5 = true;
        }
        else {
          pcVar4 = pbegin + 1;
          bVar5 = pcVar4 != pend;
          if ((bVar5) && (*pcVar4 != L'{')) {
            pcVar3 = pbegin + 2;
            do {
              pcVar4 = pcVar3;
              bVar5 = pcVar4 != pend;
              if (pcVar4 == pend) break;
              pcVar3 = pcVar4 + 1;
            } while (*pcVar4 != L'{');
          }
          if (bVar5) goto LAB_00169b3b;
          parse_format_string<false,_char32_t,_format_handler>::writer::operator()
                    ((writer *)&local_a8,pbegin,pend);
          bVar5 = false;
        }
      } while (bVar5);
    }
  }
  return;
}

Assistant:

void vformat_to(
    buffer<Char>& buf, basic_string_view<Char> fmt,
    basic_format_args<FMT_BUFFER_CONTEXT(type_identity_t<Char>)> args,
    locale_ref loc) {
  // workaround for msvc bug regarding name-lookup in module
  // link names into function scope
  using detail::arg_formatter;
  using detail::buffer_appender;
  using detail::custom_formatter;
  using detail::default_arg_formatter;
  using detail::get_arg;
  using detail::locale_ref;
  using detail::parse_format_specs;
  using detail::specs_checker;
  using detail::specs_handler;
  using detail::to_unsigned;
  using detail::type;
  using detail::write;
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> args, locale_ref loc)
        : parse_context(str), context(out, args, loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) on_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      if (arg.type() == type::custom_type) {
        parse_context.advance_to(parse_context.begin() +
                                 (begin - &*parse_context.begin()));
        visit_format_arg(custom_formatter<Char>{parse_context, context}, arg);
        return parse_context.begin();
      }
      auto specs = basic_format_specs<Char>();
      specs_checker<specs_handler<Char>> handler(
          specs_handler<Char>(specs, parse_context, context), arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}